

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O2

_Bool effect_handler_DETECT_TRAPS(effect_handler_context_t_conflict *context)

{
  chunk_conflict *c;
  _Bool _Var1;
  int iVar2;
  loc lVar3;
  object *obj;
  square *psVar4;
  int iVar5;
  uint y;
  int iVar6;
  int iVar7;
  char *fmt;
  uint uVar8;
  
  iVar6 = (player->grid).x;
  iVar5 = (player->grid).y;
  y = iVar5 - context->y;
  iVar5 = context->y + iVar5;
  iVar2 = iVar6 - context->x;
  iVar6 = context->x + iVar6;
  uVar8 = 0;
  if ((int)y < 1) {
    y = uVar8;
  }
  if (iVar2 < 1) {
    iVar2 = 0;
  }
  iVar7 = cave->height + -1;
  if (iVar5 < cave->height) {
    iVar7 = iVar5;
  }
  iVar5 = cave->width + -1;
  if (iVar6 < cave->width) {
    iVar5 = iVar6;
  }
  for (; iVar6 = iVar2, (int)y < iVar7; y = y + 1) {
    for (; iVar6 < iVar5; iVar6 = iVar6 + 1) {
      lVar3 = (loc)loc(iVar6,y);
      _Var1 = square_in_bounds_fully(cave,lVar3);
      if (_Var1) {
        _Var1 = square_isplayertrap(cave,lVar3);
        if (_Var1) {
          _Var1 = square_reveal_trap((chunk *)cave,lVar3,true,false);
          uVar8 = (uint)(byte)((byte)uVar8 | _Var1);
        }
        for (obj = square_object(cave,lVar3); c = cave, obj != (object *)0x0; obj = obj->next) {
          _Var1 = is_trapped_chest(obj);
          if (((_Var1) && (_Var1 = ignore_item_ok(player,obj), !_Var1)) &&
             ((obj->known == (object *)0x0 || (obj->known->pval != obj->pval)))) {
            object_see(player,obj);
            obj->known->pval = obj->pval;
            uVar8 = 1;
          }
        }
        lVar3 = (loc)loc(iVar6,y);
        psVar4 = square(c,lVar3);
        flag_on_dbg(psVar4->info,3,0x13,"square(cave, loc(x, y))->info","SQUARE_DTRAP");
      }
    }
  }
  fmt = "You sense no traps.";
  if (uVar8 != 0) {
    fmt = "You sense the presence of traps!";
  }
  msg(fmt);
  context->ident = true;
  return true;
}

Assistant:

bool effect_handler_DETECT_TRAPS(effect_handler_context_t *context)
{
	int x, y;
	int x1, x2, y1, y2;

	bool detect = false;

	struct object *obj;

	/* Pick an area to detect */
	y1 = player->grid.y - context->y;
	y2 = player->grid.y + context->y;
	x1 = player->grid.x - context->x;
	x2 = player->grid.x + context->x;

	if (y1 < 0) y1 = 0;
	if (x1 < 0) x1 = 0;
	if (y2 > cave->height - 1) y2 = cave->height - 1;
	if (x2 > cave->width - 1) x2 = cave->width - 1;


	/* Scan the dungeon */
	for (y = y1; y < y2; y++) {
		for (x = x1; x < x2; x++) {
			struct loc grid = loc(x, y);

			if (!square_in_bounds_fully(cave, grid)) continue;

			/* Detect traps */
			if (square_isplayertrap(cave, grid))
				/* Reveal trap */
				if (square_reveal_trap(cave, grid, true, false))
					detect = true;

			/* Scan all objects in the grid to look for traps on chests */
			for (obj = square_object(cave, grid); obj; obj = obj->next) {
				/* Skip anything not a trapped chest */
				if (!is_trapped_chest(obj)
						|| ignore_item_ok(player, obj)) {
					continue;
				}

				/* Identify once */
				if (!obj->known || obj->known->pval != obj->pval) {
					/* Hack - see the object */
					object_see(player, obj);

					/* Know the trap */
					obj->known->pval = obj->pval;

					/* We found something to detect */
					detect = true;
				}
			}
			/* Mark as trap-detected */
			sqinfo_on(square(cave, loc(x, y))->info, SQUARE_DTRAP);
		}
	}

	/* Describe */
	if (detect)
		msg("You sense the presence of traps!");

	/* Trap detection always makes you aware, even if no traps are present */
	else
		msg("You sense no traps.");

	/* Notice */
	context->ident = true;

	return true;
}